

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_perform_upgrade_tls(connectdata *conn)

{
  _Bool *done;
  CURLcode CVar1;
  
  done = &(conn->proto).imapc.ssldone;
  CVar1 = Curl_ssl_connect_nonblocking(conn,0,done);
  if (CVar1 == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      (conn->proto).imapc.state = IMAP_UPGRADETLS;
    }
    CVar1 = CURLE_OK;
    if (*done == true) {
      conn->handler = &Curl_handler_pop3s;
      conn->tls_upgraded = true;
      CVar1 = pop3_perform_capa(conn);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &pop3c->ssldone);

  if(!result) {
    if(pop3c->state != POP3_UPGRADETLS)
      state(conn, POP3_UPGRADETLS);

    if(pop3c->ssldone) {
      pop3_to_pop3s(conn);
      result = pop3_perform_capa(conn);
    }
  }

  return result;
}